

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator::init<Kernel::Literal*>
          (FastInstancesIterator *this,SubstitutionTree<Indexing::LiteralClause> *parent,Node *root,
          Literal *query,bool retrieveSubstitution,bool reversed)

{
  byte bVar1;
  InstMatcher *in_RCX;
  SubstitutionTree<Indexing::LiteralClause> *in_RDX;
  FastInstancesIterator *in_RSI;
  byte *in_RDI;
  byte in_R8B;
  byte in_R9B;
  InstanceCntr local_31;
  undefined1 local_30 [14];
  byte local_22;
  byte reversed_00;
  InstMatcher *lit;
  SubstitutionTree<Indexing::LiteralClause> *this_00;
  anon_class_8_1_8991fb9c bindSpecialVar;
  
  reversed_00 = in_R8B & 1;
  local_22 = in_R9B & 1;
  *in_RDI = reversed_00;
  lit = in_RCX;
  this_00 = in_RDX;
  bindSpecialVar.this = in_RSI;
  bVar1 = (*(code *)(*(IteratorCore<Indexing::LiteralClause_*> **)in_RDX)[1]._vptr_IteratorCore)();
  in_RDI[1] = bVar1 & 1;
  if ((in_RDI[1] & 1) == 0) {
    Lib::VirtualIterator<Indexing::LiteralClause_*>::getEmpty();
  }
  else {
    (*(code *)(*(IteratorCore<Indexing::LiteralClause_*> **)this_00)[4]._vptr_IteratorCore)
              (local_30);
  }
  Lib::VirtualIterator<Indexing::LiteralClause_*>::operator=
            ((VirtualIterator<Indexing::LiteralClause_*> *)in_RSI,
             (VirtualIterator<Indexing::LiteralClause_*> *)in_RDX);
  Lib::VirtualIterator<Indexing::LiteralClause_*>::~VirtualIterator
            ((VirtualIterator<Indexing::LiteralClause_*> *)in_RCX);
  *(SubstitutionTree<Indexing::LiteralClause> **)(in_RDI + 0xb0) = this_00;
  InstanceCntr::InstanceCntr(&local_31,(Cntr *)&(bindSpecialVar.this)->_subst);
  SubstitutionTree<Indexing::LiteralClause>::InstMatcher::reset(in_RCX);
  createBindings<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator::init<Kernel::Literal*>(Indexing::SubstitutionTree<Indexing::LiteralClause>*,Indexing::SubstitutionTree<Indexing::LiteralClause>::Node*,Kernel::Literal*,bool,bool)::_lambda(unsigned_int,Kernel::TermList)_1_>
            (this_00,(Literal *)lit,(bool)reversed_00,bindSpecialVar);
  if ((in_RDI[1] & 1) != 0) {
    SubstitutionTree<Indexing::LiteralClause>::InstMatcher::onLeafEntered((InstMatcher *)0x3406a7);
  }
  return;
}

Assistant:

void init(SubstitutionTree* parent, Node* root, TermOrLit query, bool retrieveSubstitution, bool reversed) {
        _retrieveSubstitution = retrieveSubstitution;
        _inLeaf = root->isLeaf();
        _ldIterator = _inLeaf ? static_cast<Leaf*>(root)->allChildren() : LDIterator::getEmpty();
        _root = root;
        _iterCntr = parent->_iterCnt;
        _subst.reset();

        ASS(root);

        parent->createBindings(query, reversed,
            [&](unsigned var, TermList t) { _subst.bindSpecialVar(var, t); });

        if (_inLeaf) {
          _subst.onLeafEntered(); //we reset the bindings cache
        }
      }